

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<8,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Type in0;
  Mat4 local_19c;
  Matrix<float,_3,_3> local_15c;
  undefined1 local_138 [24];
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  Matrix<float,_3,_3> local_9c;
  Matrix<float,_3,_3> local_78;
  Matrix<float,_3,_3> local_54;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              (&local_19c,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix(&local_19c,(float *)sr::(anonymous_namespace)::s_constInMat4x4)
    ;
  }
  local_138._16_4_ = local_19c.m_data.m_data[2].m_data[2];
  local_138._20_4_ = local_19c.m_data.m_data[2].m_data[3];
  fStack_120 = local_19c.m_data.m_data[3].m_data[1];
  fStack_11c = local_19c.m_data.m_data[3].m_data[2];
  local_118 = local_19c.m_data.m_data[3].m_data[3];
  fStack_114 = local_19c.m_data.m_data[0].m_data[1];
  fStack_110 = local_19c.m_data.m_data[0].m_data[2];
  fStack_10c = local_19c.m_data.m_data[0].m_data[3];
  local_108 = local_19c.m_data.m_data[2].m_data[1];
  fStack_104 = local_19c.m_data.m_data[2].m_data[2];
  fStack_100 = local_19c.m_data.m_data[2].m_data[3];
  fStack_fc = local_19c.m_data.m_data[3].m_data[1];
  local_f8 = local_19c.m_data.m_data[3].m_data[2];
  fStack_f4 = local_19c.m_data.m_data[3].m_data[3];
  fStack_f0 = local_19c.m_data.m_data[0].m_data[1];
  fStack_ec = local_19c.m_data.m_data[0].m_data[2];
  local_e8 = local_19c.m_data.m_data[0].m_data[3];
  fStack_e4 = local_19c.m_data.m_data[1].m_data[1];
  fStack_e0 = local_19c.m_data.m_data[1].m_data[2];
  fStack_dc = local_19c.m_data.m_data[1].m_data[3];
  local_d8 = local_19c.m_data.m_data[3].m_data[1];
  fStack_d4 = local_19c.m_data.m_data[3].m_data[2];
  fStack_d0 = local_19c.m_data.m_data[3].m_data[3];
  fStack_cc = local_19c.m_data.m_data[0].m_data[1];
  local_c8 = local_19c.m_data.m_data[0].m_data[2];
  fStack_c4 = local_19c.m_data.m_data[0].m_data[3];
  fStack_c0 = local_19c.m_data.m_data[1].m_data[1];
  fStack_bc = local_19c.m_data.m_data[1].m_data[2];
  local_b8 = local_19c.m_data.m_data[1].m_data[3];
  fStack_b4 = local_19c.m_data.m_data[2].m_data[1];
  fStack_b0 = local_19c.m_data.m_data[2].m_data[2];
  fStack_ac = local_19c.m_data.m_data[2].m_data[3];
  tcu::Matrix<float,_3,_3>::Matrix(&local_15c,(float *)local_138);
  fVar1 = determinant<3>(&local_15c);
  tcu::Matrix<float,_3,_3>::Matrix(&local_54,&fStack_114);
  fVar2 = determinant<3>(&local_54);
  tcu::Matrix<float,_3,_3>::Matrix(&local_78,&fStack_f0);
  fVar3 = determinant<3>(&local_78);
  tcu::Matrix<float,_3,_3>::Matrix(&local_9c,&fStack_cc);
  fVar4 = determinant<3>(&local_9c);
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)&local_15c,
             (fVar3 * local_19c.m_data.m_data[2].m_data[0] +
             (fVar1 * local_19c.m_data.m_data[0].m_data[0] -
             fVar2 * local_19c.m_data.m_data[1].m_data[0])) -
             fVar4 * local_19c.m_data.m_data[3].m_data[0]);
  local_138._0_8_ = &evalCtx->color;
  local_138._8_4_ = 0;
  local_138._12_4_ = 1;
  local_138._16_4_ = 2;
  tcu::VecAccess<float,_4,_3>::operator=
            ((VecAccess<float,_4,_3> *)local_138,(Vector<float,_3> *)&local_15c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = Vec3(determinant(in0));
	}